

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::AddUtility(cmTarget *this,string *name,cmMakefile *mf)

{
  pointer pcVar1;
  bool bVar2;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_50;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  string *name_local;
  cmTarget *this_local;
  
  local_20 = mf;
  mf_local = (cmMakefile *)name;
  name_local = (string *)this;
  pcVar1 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  std::__cxx11::string::string((string *)(local_80 + 0x10),(string *)mf_local);
  bVar2 = local_20 == (cmMakefile *)0x0;
  if (bVar2) {
    memset(local_80,0,0x10);
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_80);
  }
  else {
    cmMakefile::GetBacktrace((cmMakefile *)local_80);
  }
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_80 + 0x30),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_80 + 0x10),
             (cmListFileBacktrace *)local_80);
  std::
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::insert(&pcVar1->Utilities,(value_type *)(local_80 + 0x30));
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_80 + 0x30));
  if (bVar2) {
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_80);
  }
  else {
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_80);
  }
  std::__cxx11::string::~string((string *)(local_80 + 0x10));
  return;
}

Assistant:

void cmTarget::AddUtility(std::string const& name, cmMakefile* mf)
{
  impl->Utilities.insert(
    BT<std::string>(name, mf ? mf->GetBacktrace() : cmListFileBacktrace()));
}